

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

int archive_write_set_format_mtree_classic(archive *_a)

{
  long lVar1;
  int iVar2;
  archive_write *a;
  
  iVar2 = archive_write_set_format_mtree_default(_a,"archive_write_set_format_mtree_classic");
  if (iVar2 == 0) {
    lVar1 = *(long *)&_a[1].current_codepage;
    *(undefined4 *)(lVar1 + 0xd8) = 1;
    *(undefined4 *)(lVar1 + 0xfc) = 1;
  }
  return iVar2;
}

Assistant:

int
archive_write_set_format_mtree_classic(struct archive *_a)
{
	int r;

	r = archive_write_set_format_mtree_default(_a,
		"archive_write_set_format_mtree_classic");
	if (r == ARCHIVE_OK) {
		struct archive_write *a = (struct archive_write *)_a;
		struct mtree_writer *mtree;

		mtree = (struct mtree_writer *)a->format_data;

		/* Set to output a mtree archive in classic format. */
		mtree->classic = 1;
		/* Basically, mtree classic format uses '/set' global
		 * value. */
		mtree->output_global_set = 1;
	}
	return (r);
}